

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

bool __thiscall DynamicHistogram<double>::merge(DynamicHistogram<double> *this)

{
  FixedSizeCache<double> *this_00;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  value_type_conflict3 local_20;
  
  cVar8 = this->_initialized;
  if ((this->_cache)._count != 0) {
    this_00 = &this->_cache;
    if ((bool)cVar8 == false) {
      dVar17 = FixedSizeCache<double>::max(this_00);
      this->_binMax = dVar17;
      dVar17 = FixedSizeCache<double>::min(this_00);
      this->_binMin = dVar17;
      this->_binWidth = (this->_binMax - dVar17) / (double)this->_binCount;
      if (0 < (this->_cache)._count) {
        iVar9 = 0;
        do {
          dVar17 = FixedSizeCache<double>::at(this_00,iVar9);
          add_(this,dVar17);
          iVar9 = iVar9 + 1;
        } while (iVar9 < (this->_cache)._count);
      }
      local_20 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&(this->_cache)._data,
                 (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,&local_20);
      (this->_cache)._count = 0;
      this->_initialized = true;
    }
    else {
      this->_numMerges = this->_numMerges + 1;
      dVar17 = FixedSizeCache<double>::min(this_00);
      if ((this->_binMax != dVar17) || (NAN(this->_binMax) || NAN(dVar17))) {
        dVar17 = floor((dVar17 - this->_binMin) / this->_binWidth);
        iVar9 = (int)dVar17;
      }
      else {
        iVar9 = this->_binCount + -1;
      }
      dVar17 = this->_binWidth;
      dVar18 = this->_binMin;
      FixedSizeCache<double>::min(this_00);
      dVar17 = this->_binWidth * -0.5 + ((double)iVar9 + 0.5) * dVar17 + dVar18;
      dVar18 = FixedSizeCache<double>::max(this_00);
      if ((this->_binMax != dVar18) || (NAN(this->_binMax) || NAN(dVar18))) {
        dVar18 = floor((dVar18 - this->_binMin) / this->_binWidth);
        iVar9 = (int)dVar18;
      }
      else {
        iVar9 = this->_binCount + -1;
      }
      dVar18 = this->_binWidth;
      dVar1 = this->_binMin;
      FixedSizeCache<double>::max(this_00);
      dVar2 = this->_binWidth;
      dVar15 = dVar2 * 0.5 + ((double)iVar9 + 0.5) * dVar18 + dVar1;
      dVar18 = this->_binMax;
      dVar1 = this->_binMin;
      dVar16 = dVar18;
      if (dVar18 <= dVar15) {
        dVar16 = dVar15;
      }
      dVar15 = dVar1;
      if (dVar17 <= dVar1) {
        dVar15 = dVar17;
      }
      dVar17 = ceil((dVar16 - dVar15) / (dVar18 - dVar1));
      iVar9 = this->_binCount;
      dVar17 = (double)((int)dVar17 * iVar9) * dVar2;
      dVar15 = dVar15 - (double)((int)(((dVar17 + dVar15) - dVar16) / dVar2) / 2) * dVar2;
      dVar17 = dVar17 + dVar15;
      dVar18 = (dVar17 - dVar15) / (double)iVar9;
      if (0 < (long)iVar9) {
        pdVar3 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = (long)(this->_frequencies).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
        pdVar4 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (long)(this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
        uVar14 = 0;
        do {
          uVar12 = uVar11;
          uVar13 = uVar11;
          if ((uVar11 == uVar14) ||
             (uVar13 = (ulong)(int)(((((double)(int)uVar14 + 0.5) * this->_binWidth + this->_binMin)
                                    - dVar15) / dVar18), uVar12 = uVar10, uVar10 <= uVar13)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar13,uVar12);
          }
          pdVar4[uVar13] = pdVar3[uVar14] + pdVar4[uVar13];
          uVar14 = uVar14 + 1;
        } while ((long)iVar9 != uVar14);
      }
      pdVar6 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar3 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar4 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = pdVar4;
      (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar5;
      (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = pdVar6;
      (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar7;
      (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar3;
      local_20 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&this->_temp,(long)pdVar5 - (long)pdVar4 >> 3,&local_20);
      this->_binMax = dVar17;
      this->_binMin = dVar15;
      this->_binWidth = dVar18;
      if (0 < (this->_cache)._count) {
        iVar9 = 0;
        do {
          dVar17 = FixedSizeCache<double>::at(this_00,iVar9);
          add_(this,dVar17);
          iVar9 = iVar9 + 1;
        } while (iVar9 < (this->_cache)._count);
      }
      local_20 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&(this->_cache)._data,
                 (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,&local_20);
      (this->_cache)._count = 0;
    }
    cVar8 = '\x01';
  }
  return (bool)cVar8;
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }